

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O1

void __thiscall
Am_Enum_Support::Am_Enum_Support(Am_Enum_Support *this,char *string,Am_Value_Type in_type)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  char **ppcVar4;
  int iVar5;
  ulong uVar6;
  
  (this->super_Am_Type_Support)._vptr_Am_Type_Support = (_func_int **)&PTR_Print_002e3d08;
  this->type = in_type;
  sVar3 = strlen(string);
  uVar2 = (uint)sVar3;
  uVar6 = (ulong)(int)(uVar2 + 1);
  if ((long)uVar6 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __dest = (char *)operator_new__(uVar6);
  strcpy(__dest,string);
  this->number = 1;
  if (0 < (int)uVar2) {
    iVar5 = 1;
    uVar6 = 0;
    do {
      if (string[uVar6] == ' ') {
        iVar5 = iVar5 + 1;
        this->number = iVar5;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  uVar6 = (long)this->number * 8;
  if ((long)this->number < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  ppcVar4 = (char **)operator_new__(uVar6);
  *ppcVar4 = __dest;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)(uVar2 & 0x7fffffff);
    iVar5 = 1;
    pcVar1 = __dest;
    do {
      if (*pcVar1 == ' ') {
        *pcVar1 = '\0';
        ppcVar4[iVar5] = pcVar1 + 1;
        iVar5 = iVar5 + 1;
      }
      uVar6 = uVar6 - 1;
      pcVar1 = pcVar1 + 1;
    } while (uVar6 != 0);
  }
  this->value_string = __dest;
  this->item = ppcVar4;
  Am_Register_Support(in_type,&this->super_Am_Type_Support);
  return;
}

Assistant:

Am_Enum_Support::Am_Enum_Support(const char *string, Am_Value_Type in_type)
{
  type = in_type;
  int len = strlen(string);
  char *hold = new char[len + 1];
  strcpy(hold, string);
  int i;
  number = 1;
  for (i = 0; i < len; ++i) {
    if (string[i] == ' ')
      ++number;
  }
  char **array = new char *[number];
  array[0] = hold;
  int j = 1;
  for (i = 0; i < len; ++i) {
    if (hold[i] == ' ') {
      hold[i] = '\0';
      array[j] = &hold[i + 1];
      ++j;
    }
  }
  value_string = hold;
  item = array;
  Am_Register_Support(type, this);
}